

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int pigpio_command_ext(int pi,int command,int p1,int p2,int p3,int extents,gpioExtent_t *ext,int rl)

{
  long *plVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  ulong uVar5;
  cmdCmd_t cmd;
  
  iVar2 = -0x7db;
  if (((uint)pi < 0x20) && (iVar2 = -0x7db, gPiInUse[(uint)pi] != 0)) {
    cmd.cmd = command;
    cmd.p1 = p1;
    cmd.p2 = p2;
    cmd.field_3 = (anon_union_4_3_5af155d6_for_cmdCmd_t_3)p3;
    _pml(pi);
    sVar3 = send(gPigCommand[(uint)pi],&cmd,0x10,0);
    if (sVar3 == 0x10) {
      uVar5 = (ulong)(uint)extents;
      if (extents < 1) {
        uVar5 = 0;
      }
      uVar4 = 0;
      do {
        if (uVar5 * 0x18 + 0x18 == uVar4 + 0x18) {
          sVar3 = recv(gPigCommand[(uint)pi],&cmd,0x10,0x100);
          if (sVar3 != 0x10) {
            _pmu(pi);
            return -0x7d1;
          }
          if (rl == 0) {
            return cmd.field_3.p3;
          }
          _pmu(pi);
          return cmd.field_3.p3;
        }
        sVar3 = send(gPigCommand[(uint)pi],*(void **)((long)&ext->ptr + uVar4),
                     *(size_t *)((long)&ext->size + uVar4),0);
        plVar1 = (long *)((long)&ext->size + uVar4);
        uVar4 = uVar4 + 0x18;
      } while (sVar3 == *plVar1);
    }
    _pmu(pi);
    iVar2 = -2000;
  }
  return iVar2;
}

Assistant:

static int pigpio_command_ext
   (int pi, int command, int p1, int p2, int p3,
    int extents, gpioExtent_t *ext, int rl)
{
   int i;
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.p3  = p3;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   for (i=0; i<extents; i++)
   {
      if (send(gPigCommand[pi], ext[i].ptr, ext[i].size, 0) != ext[i].size)
      {
         _pmu(pi);
         return pigif_bad_send;
      }
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }
   if (rl) _pmu(pi);

   return cmd.res;
}